

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosPluginManager.cpp
# Opt level: O3

PluginManager * adios2::plugin::PluginManager::GetInstance(void)

{
  runtime_error *this;
  
  if (m_Instance == (PluginManager *)0x0) {
    if (m_Destroyed == '\x01') {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Dead reference to PluginManager singleton");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    CreateInstance();
  }
  return m_Instance;
}

Assistant:

PluginManager &PluginManager::GetInstance()
{
    if (!m_Instance)
    {
        if (m_Destroyed)
        {
            throw std::runtime_error("Dead reference to PluginManager singleton");
        }
        else
        {
            CreateInstance();
        }
    }
    return *m_Instance;
}